

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

bool cinemo::isValidFileType(string *file,char *ext)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  string fileExt;
  char *local_58;
  undefined8 local_50;
  char local_48 [16];
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  local_50 = 0;
  local_48[0] = '\0';
  local_58 = local_48;
  lVar2 = std::__cxx11::string::rfind((char)file,0x2e);
  if (lVar2 == -1) {
    bVar3 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)local_38,(ulong)file);
    std::__cxx11::string::operator=((string *)&local_58,(string *)local_38);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
    iVar1 = strcasecmp(local_58,ext);
    bVar3 = iVar1 == 0;
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  return bVar3;
}

Assistant:

bool isValidFileType(const string& file, const char* ext) {
        string fileExt;
        string::size_type i;

        i = file.rfind('.');

        if (i != string::npos) {
            fileExt = file.substr(i + 1);
            return !strcasecmp(fileExt.c_str(), ext);
        }

        return false;
    }